

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

string * __thiscall
google::protobuf::stringpiece_internal::StringPiece::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StringPiece *this)

{
  const_pointer pcVar1;
  size_type sVar2;
  allocator local_2d [20];
  allocator local_19;
  StringPiece *local_18;
  StringPiece *this_local;
  
  local_18 = this;
  this_local = (StringPiece *)__return_storage_ptr__;
  if (this->ptr_ == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pcVar1 = data(this);
    sVar2 = size(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,sVar2,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
    if (ptr_ == nullptr) return "";
    return std::string(data(), static_cast<size_type>(size()));
  }